

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntlEngineInterfaceExtensionObject.cpp
# Opt level: O1

Var Js::IntlEngineInterfaceExtensionObject::EntryIntl_PluralRulesKeywords
              (RecyclableObject *function,CallInfo callInfo,...)

{
  ScriptContext *scriptContext;
  code *pcVar1;
  Type scriptContext_00;
  ScopedICUObject<UEnumeration_*,_&uenum_close_70> SVar2;
  bool bVar3;
  undefined4 *puVar4;
  Var pvVar5;
  JavascriptArray *pJVar6;
  DynamicObject *stateObject;
  FinalizableUPluralRules *pFVar7;
  LPCSTR pCVar8;
  char16 *content;
  JavascriptString *pJVar9;
  ulong uVar10;
  uint in_stack_00000010;
  undefined1 local_60 [8];
  Arguments args;
  int local_44;
  ScopedICUObject<UEnumeration_*,_&uenum_close_70> SStack_40;
  UErrorCode status;
  ScopedUEnumeration keywords;
  int valueLength;
  UErrorCode status_1;
  
  scriptContext =
       (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
       scriptContext.ptr;
  ThreadContext::ProbeStack(scriptContext->threadContext,0xc00,scriptContext,(PVOID)0x0);
  if (in_stack_00000010 != callInfo._0_4_) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                ,0xbbe,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar3) goto LAB_00b68558;
    *puVar4 = 0;
  }
  args.Info = (Type)&stack0x00000018;
  local_60 = (undefined1  [8])callInfo;
  if ((callInfo._0_4_ >> 0x18 & 1) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                ,0xbbe,"(!(callInfo.Flags & CallFlags_New))",
                                "!(callInfo.Flags & CallFlags_New)");
    if (!bVar3) goto LAB_00b68558;
    *puVar4 = 0;
  }
  args.Values = (Type)(((((function->type).ptr)->javascriptLibrary).ptr)->
                      super_JavascriptLibraryBase).scriptContext.ptr;
  if (((ulong)local_60 & 0xffffff) == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                ,0xbbe,"(argCount > 0)","Should always have implicit \'this\'");
    if (!bVar3) goto LAB_00b68558;
    *puVar4 = 0;
  }
  if ((local_60._0_4_ & 0xffffff) == 2) {
    pvVar5 = Arguments::operator[]((Arguments *)local_60,1);
    bVar3 = DynamicObject::IsBaseDynamicObject(pvVar5);
    if (!bVar3) goto LAB_00b68309;
  }
  else {
LAB_00b68309:
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                ,0xbbf,
                                "((args.Info.Count == 2 && DynamicObject::IsBaseDynamicObject(args[1])))"
                                ,"Intl platform function given bad arguments");
    if (!bVar3) goto LAB_00b68558;
    *puVar4 = 0;
  }
  scriptContext_00 = args.Values;
  pJVar6 = JavascriptLibrary::CreateArray((JavascriptLibrary *)args.Values[1],0);
  pvVar5 = Arguments::operator[]((Arguments *)local_60,1);
  stateObject = UnsafeVarTo<Js::DynamicObject>(pvVar5);
  pFVar7 = GetOrCreateCachedUPluralRules(stateObject,(ScriptContext *)scriptContext_00);
  local_44 = 0;
  SStack_40.object = (UEnumeration *)uplrules_getKeywords_70(pFVar7->resource,&local_44);
  if (local_44 == 7) {
LAB_00b68553:
    Throw::OutOfMemory();
  }
  if (0 < local_44 || local_44 == -0x7c) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    pCVar8 = (LPCSTR)u_errorName_70(local_44);
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                ,0xbcd,"(false)",pCVar8);
    if (!bVar3) {
LAB_00b68558:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  SVar2.object = SStack_40.object;
  keywords.object._0_4_ = 0;
  keywords.object._4_4_ = 0;
  content = (char16 *)uenum_unext_70(SStack_40.object);
  if (content != (char16 *)0x0) {
    uVar10 = 0;
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    do {
      if (keywords.object._4_4_ == 7) goto LAB_00b68553;
      if (keywords.object._4_4_ < 1 && keywords.object._4_4_ != -0x7c) {
        if ((int)(charcount_t)keywords.object < 1) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          *puVar4 = 1;
          bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                      ,0x1d4,"(valueLength > 0)","valueLength > 0");
          goto LAB_00b684e9;
        }
      }
      else {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        *puVar4 = 1;
        pCVar8 = (LPCSTR)u_errorName_70(keywords.object._4_4_);
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                    ,0x1d4,"(false)",pCVar8);
LAB_00b684e9:
        if (bVar3 == false) goto LAB_00b68558;
        *puVar4 = 0;
      }
      pJVar9 = JavascriptString::NewCopyBuffer
                         (content,(charcount_t)keywords.object,(ScriptContext *)args.Values);
      (*(pJVar6->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
        super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x29])
                (pJVar6,uVar10,pJVar9,0);
      content = (char16 *)
                uenum_unext_70(SVar2.object,&keywords,(undefined1 *)((long)&keywords.object + 4));
      uVar10 = (ulong)((int)uVar10 + 1);
    } while (content != (char16 *)0x0);
  }
  PlatformAgnostic::ICUHelpers::ScopedICUObject<UEnumeration_*,_&uenum_close_70>::~ScopedICUObject
            (&stack0xffffffffffffffc0);
  return pJVar6;
}

Assistant:

Var IntlEngineInterfaceExtensionObject::EntryIntl_PluralRulesKeywords(RecyclableObject *function, CallInfo callInfo, ...)
    {
#ifdef INTL_ICU
        EngineInterfaceObject_CommonFunctionProlog(function, callInfo);
        INTL_CHECK_ARGS(args.Info.Count == 2 && DynamicObject::IsBaseDynamicObject(args[1]));

        JavascriptArray *ret = scriptContext->GetLibrary()->CreateArray(0);

        // uplrules_getKeywords is only stable since ICU 61.
        // For ICU < 61, we can fake it by creating an array of ["other"], which
        // uplrules_getKeywords is guaranteed to return at minimum.
        // This array is only used in resolved options, so the majority of the functionality can remain (namely, select() still works)
#if defined(ICU_VERSION) && ICU_VERSION >= 61
        DynamicObject *state = UnsafeVarTo<DynamicObject>(args[1]);
        FinalizableUPluralRules *pr = GetOrCreateCachedUPluralRules(state, scriptContext);

        UErrorCode status = U_ZERO_ERROR;
        ScopedUEnumeration keywords(uplrules_getKeywords(*pr, &status));
        ICU_ASSERT(status, true);

        ForEachUEnumeration16(keywords, [&](int index, const char16 *kw, charcount_t kwLength)
        {
            ret->SetItem(index, JavascriptString::NewCopyBuffer(kw, kwLength, scriptContext), PropertyOperation_None);
        });
#else
        ret->SetItem(0, scriptContext->GetLibrary()->GetIntlPluralRulesOtherString(), PropertyOperation_None);
#endif

        return ret;
#else
        AssertOrFailFastMsg(false, "Intl-WinGlob should not be using PluralRulesKeywords");
        return nullptr;
#endif
    }